

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# importer.cpp
# Opt level: O0

void __thiscall
Importer_importInvalidComponentFromCellmlModelComponentError_Test::
Importer_importInvalidComponentFromCellmlModelComponentError_Test
          (Importer_importInvalidComponentFromCellmlModelComponentError_Test *this)

{
  Importer_importInvalidComponentFromCellmlModelComponentError_Test *this_local;
  
  testing::Test::Test(&this->super_Test);
  *(undefined ***)this =
       &PTR__Importer_importInvalidComponentFromCellmlModelComponentError_Test_001a2170;
  return;
}

Assistant:

TEST(Importer, importInvalidComponentFromCellmlModelComponentError)
{
    auto e = "Encountered an error when resolving component 'component1_imported' from '" + resourcePath("importer/invalid_model.cellml") + "'.";

    auto importer = libcellml::Importer::create();
    auto parser = libcellml::Parser::create();

    auto model = parser->parseModel(fileContents("importer/import_invalid_component.cellml"));
    model->component(0)->setImportReference("component1");
    model->component(0)->setName("component1_imported");

    importer->resolveImports(model, resourcePath("importer"));
    EXPECT_EQ(size_t(1), importer->errorCount());
    EXPECT_EQ(e, importer->error(0)->description());
}